

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O1

void __thiscall
QtMWidgets::NavigationButton::NavigationButton
          (NavigationButton *this,Direction direction,QWidget *parent)

{
  NavigationButtonPrivate *this_00;
  undefined4 *puVar1;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  QObject local_38 [8];
  QObject local_30 [8];
  
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_00199e38;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationButton_0019a000;
  this_00 = (NavigationButtonPrivate *)operator_new(0x40);
  this_00->q = this;
  this_00->direction = direction;
  (this_00->color).cspec = Invalid;
  (this_00->color).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->color).ct + 2) = 0;
  (this_00->baseColor).cspec = Invalid;
  (this_00->baseColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->baseColor).ct + 2) = 0;
  (this_00->textColor).cspec = Invalid;
  (this_00->textColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->textColor).ct + 2) = 0;
  (this->d).d = this_00;
  NavigationButtonPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  local_48 = QAbstractButton::pressed;
  local_40 = 0;
  local_58 = _q_pressed;
  local_50 = (ImplFn)0x0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::NavigationButton::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar1 + 4) = _q_pressed;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_30,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_48 = QAbstractButton::released;
  local_40 = 0;
  local_58 = _q_released;
  local_50 = (ImplFn)0x0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::NavigationButton::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar1 + 4) = _q_released;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)this,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)&local_58,
             (ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

NavigationButton::NavigationButton( Direction direction, QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new NavigationButtonPrivate( this, direction ) )
{
	d->init();

	connect( this, &QAbstractButton::pressed,
		this, &NavigationButton::_q_pressed );
	connect( this, &QAbstractButton::released,
		this, &NavigationButton::_q_released );
}